

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Moira.cpp
# Opt level: O0

u16 __thiscall moira::Moira::getIrqVector(Moira *this,u8 level)

{
  int iVar1;
  undefined8 in_RDX;
  u8 level_local;
  Moira *this_local;
  
  if (level < 8) {
    switch(this->irqMode) {
    case AUTO:
      this_local._6_2_ = level + 0x18;
      break;
    case USER:
      iVar1 = (*this->_vptr_Moira[9])(this,(ulong)level,in_RDX,CONCAT71(0x56ff,level));
      this_local._6_2_ = (ushort)iVar1 & 0xff;
      break;
    case SPURIOUS:
      this_local._6_2_ = 0x18;
      break;
    case UNINITIALIZED:
      this_local._6_2_ = 0xf;
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/dirkwhoffmann[P]Moira/Moira/Moira.cpp"
                    ,0x353,"u16 moira::Moira::getIrqVector(u8) const");
    }
    return this_local._6_2_;
  }
  __assert_fail("level < 8",
                "/workspace/llm4binary/github/license_c_cmakelists/dirkwhoffmann[P]Moira/Moira/Moira.cpp"
                ,0x349,"u16 moira::Moira::getIrqVector(u8) const");
}

Assistant:

u16
Moira::getIrqVector(u8 level) const {

    assert(level < 8);

    switch (irqMode) {

        case IrqMode::AUTO:          return 24 + level;
        case IrqMode::USER:          return readIrqUserVector(level) & 0xFF;
        case IrqMode::SPURIOUS:      return 24;
        case IrqMode::UNINITIALIZED: return 15;

        default:
            fatalError;
    }
}